

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

shared_ptr<wallet::CWallet> wallet::TestLoadWallet(WalletContext *context)

{
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  allocator<char> *in_RSI;
  element_type *in_RDI;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> sVar2;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> database;
  vector<bilingual_str,_std::allocator<bilingual_str>_> warnings;
  DatabaseStatus status;
  bilingual_str error;
  DatabaseOptions options;
  DatabaseOptions *in_stack_fffffffffffffec8;
  vector<bilingual_str,_std::allocator<bilingual_str>_> *this;
  bilingual_str *in_stack_ffffffffffffff00;
  element_type *options_00;
  pointer in_stack_ffffffffffffff18;
  WalletContext *in_stack_ffffffffffffff20;
  pointer in_stack_ffffffffffffff28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  options_00 = in_RDI;
  DatabaseOptions::DatabaseOptions(in_stack_fffffffffffffec8);
  bilingual_str::bilingual_str((bilingual_str *)in_stack_fffffffffffffec8);
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::vector
            ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_fffffffffffffec8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffff18->original,(char *)options_00,in_RSI);
  MakeWalletDatabase(&in_stack_ffffffffffffff18->original,(DatabaseOptions *)options_00,
                     (DatabaseStatus *)in_RSI,in_stack_ffffffffffffff00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffec8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff27);
  this = (vector<bilingual_str,_std::allocator<bilingual_str>_> *)&stack0xffffffffffffff18;
  std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             in_stack_fffffffffffffec8,
             (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             0xec50da);
  TestLoadWallet((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *
                 )in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                 (uint64_t)in_stack_ffffffffffffff18);
  std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::~unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             this);
  std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::~unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             this);
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector(this);
  bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffec8);
  DatabaseOptions::~DatabaseOptions(in_stack_fffffffffffffec8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    sVar2.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar2.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
    return (shared_ptr<wallet::CWallet>)
           sVar2.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<CWallet> TestLoadWallet(WalletContext& context)
{
    DatabaseOptions options;
    options.create_flags = WALLET_FLAG_DESCRIPTORS;
    DatabaseStatus status;
    bilingual_str error;
    std::vector<bilingual_str> warnings;
    auto database = MakeWalletDatabase("", options, status, error);
    return TestLoadWallet(std::move(database), context, options.create_flags);
}